

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N,char *zContext)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  uint *puVar5;
  DbPage *pPg;
  int iVar6;
  BtShared *pBVar7;
  u32 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  DbPage *pOvflPage;
  DbPage *local_38;
  
  uVar9 = iPage;
  uVar14 = N;
  if (0 < N) {
    do {
      if (pCheck->mxErr == 0) {
        return;
      }
      if ((int)uVar9 < 1) {
        checkAppendMsg(pCheck,zContext,"%d of %d pages missing from overflow list starting at %d",
                       (ulong)uVar14,(ulong)(uint)N,(ulong)(uint)iPage);
        return;
      }
      iVar6 = checkRef(pCheck,uVar9,zContext);
      if (iVar6 != 0) {
        return;
      }
      iVar6 = sqlite3PagerAcquire(pCheck->pPager,uVar9,&local_38,0);
      pPg = local_38;
      if (iVar6 != 0) {
        checkAppendMsg(pCheck,zContext,"failed to get page %d",(ulong)uVar9);
        return;
      }
      uVar13 = uVar14 - 1;
      puVar5 = (uint *)local_38->pData;
      if (isFreeList == 0) {
        if ((uVar14 != 1) && (pCheck->pBt->autoVacuum != '\0')) {
          uVar14 = *puVar5;
          checkPtrmap(pCheck,uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                             uVar14 << 0x18,'\x04',uVar9,zContext);
        }
      }
      else {
        uVar11 = puVar5[1];
        bVar1 = *(byte *)((long)puVar5 + 5);
        bVar2 = *(byte *)((long)puVar5 + 6);
        bVar3 = *(byte *)((long)puVar5 + 7);
        pBVar7 = pCheck->pBt;
        if (pBVar7->autoVacuum != '\0') {
          checkPtrmap(pCheck,uVar9,'\x02',0,zContext);
          pBVar7 = pCheck->pBt;
        }
        iVar6 = (uint)(byte)uVar11 * 0x1000000;
        iVar10 = (uint)bVar1 * 0x10000;
        uVar11 = (uint)bVar2 * 0x100;
        uVar9 = iVar10 + iVar6 | uVar11 | (uint)bVar3;
        uVar4 = pBVar7->usableSize;
        uVar8 = uVar4 + 3;
        if (-1 < (int)uVar4) {
          uVar8 = uVar4;
        }
        if (((int)uVar8 >> 2) + -2 < (int)uVar9) {
          checkAppendMsg(pCheck,zContext,"freelist leaf count too big on page %d");
          uVar13 = uVar14 - 2;
        }
        else {
          if (0 < (int)uVar9) {
            uVar12 = 0;
            do {
              uVar14 = puVar5[uVar12 + 2];
              uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18;
              if (pCheck->pBt->autoVacuum != '\0') {
                checkPtrmap(pCheck,uVar14,'\x02',0,zContext);
              }
              checkRef(pCheck,uVar14,zContext);
              uVar12 = uVar12 + 1;
            } while (uVar11 + bVar3 + iVar6 + iVar10 != uVar12);
          }
          uVar13 = uVar13 - uVar9;
        }
      }
      uVar9 = *puVar5;
      sqlite3PagerUnref(pPg);
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar14 = uVar13;
    } while (0 < (int)uVar13);
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N,                /* Expected number of pages in the list */
  char *zContext        /* Context for error messages */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck, zContext,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage, zContext) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage) ){
      checkAppendMsg(pCheck, zContext, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0, zContext);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck, zContext,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0, zContext);
          }
#endif
          checkRef(pCheck, iFreePage, zContext);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage, zContext);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
}